

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O0

void amrex::MLLinOp::makeConsolidatedDMap
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *ba,
               Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *dm,
               int ratio,int strategy)

{
  int iVar1;
  bool bVar2;
  MPI_Comm MVar3;
  MPI_Comm MVar4;
  Long LVar5;
  reference piVar6;
  int *piVar7;
  reference piVar8;
  int in_ECX;
  int in_EDX;
  double dVar9;
  Vector<int,_std::allocator<int>_> pmap_g;
  int *x_2;
  iterator __end6;
  iterator __begin6;
  Vector<int,_std::allocator<int>_> *__range6;
  int ibox;
  const_iterator __end8;
  const_iterator __begin8;
  value_type *__range8;
  int iproc;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *sfc;
  div_t d;
  int *x_1;
  iterator __end5;
  iterator __begin5;
  Vector<int,_std::allocator<int>_> *__range5;
  int nprocs_con;
  int *x;
  iterator __end4;
  iterator __begin4;
  Vector<int,_std::allocator<int>_> *__range4;
  Vector<int,_std::allocator<int>_> pmap;
  Vector<int,_std::allocator<int>_> *pmap_fine;
  int nprocs;
  int N;
  int i;
  int factor;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe58;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *in_stack_fffffffffffffe60;
  Vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_fffffffffffffe70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_108;
  undefined1 *local_100;
  int local_f4;
  int *local_f0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_e8;
  const_reference local_e0;
  int local_d4;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_d0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_b8;
  div_t local_b0;
  reference local_a8;
  int *local_a0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_98;
  undefined1 *local_90;
  int local_84;
  reference in_stack_ffffffffffffff80;
  iterator in_stack_ffffffffffffff88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  undefined1 *local_68;
  undefined1 local_48 [24];
  Vector<int,_std::allocator<int>_> *local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  local_1c = 1;
  local_20 = 1;
  local_18 = in_ECX;
  local_14 = in_EDX;
  LVar5 = Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::size
                    ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x150b468);
  local_24 = (int)LVar5;
  for (; local_20 < local_24; local_20 = local_20 + 1) {
    Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
    bVar2 = DistributionMapping::empty((DistributionMapping *)0x150b4a0);
    if (bVar2) {
      local_1c = local_1c * local_14;
      local_28 = ParallelContext::NProcsSub();
      Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
                ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
                 in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
      local_30 = DistributionMapping::ProcessorMap((DistributionMapping *)0x150b4ee);
      Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x150b503);
      std::allocator<int>::allocator((allocator<int> *)0x150b51a);
      Vector<int,_std::allocator<int>_>::vector
                ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60,
                 (size_type)in_stack_fffffffffffffe58,(allocator_type *)0x150b531);
      std::allocator<int>::~allocator((allocator<int> *)0x150b540);
      std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x150b54d);
      std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x150b55f);
      Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x150b571);
      ParallelContext::global_to_local_rank
                ((int *)in_stack_fffffffffffffe60,(int *)in_stack_fffffffffffffe58,0);
      if (local_18 == 1) {
        local_68 = local_48;
        local_70._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffe58);
        in_stack_ffffffffffffff88 =
             std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffe58);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffffe60,
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffffe58), bVar2) {
          in_stack_ffffffffffffff80 =
               __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_70);
          *in_stack_ffffffffffffff80 = *in_stack_ffffffffffffff80 / local_14;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_70);
        }
      }
      else if (local_18 == 2) {
        dVar9 = ceil((double)local_28 / (double)local_1c);
        local_84 = (int)dVar9;
        local_90 = local_48;
        local_98._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffe58);
        local_a0 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffe58);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffffe60,
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffffe58), bVar2) {
          local_a8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_98);
          local_b0 = div(*local_a8,local_84);
          *local_a8 = local_b0.rem;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_98);
        }
      }
      else if (local_18 == 3) {
        if (local_1c == local_14) {
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                    (in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
          ParallelContext::NProcsSub();
          DistributionMapping::makeSFC
                    ((BoxArray *)in_stack_ffffffffffffff88._M_current,
                     SUB81((ulong)in_stack_ffffffffffffff80 >> 0x38,0),
                     (int)in_stack_ffffffffffffff80);
          local_b8 = &local_d0;
          for (local_d4 = 0; local_d4 < local_28; local_d4 = local_d4 + 1) {
            local_e0 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[](local_b8,(long)local_d4);
            local_e8._M_current =
                 (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffe58);
            local_f0 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffe58)
            ;
            while (bVar2 = __gnu_cxx::operator!=
                                     ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)in_stack_fffffffffffffe60,
                                      (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)in_stack_fffffffffffffe58), bVar2) {
              piVar6 = __gnu_cxx::
                       __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                       operator*(&local_e8);
              iVar1 = local_d4;
              local_f4 = *piVar6;
              piVar7 = Vector<int,_std::allocator<int>_>::operator[]
                                 ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60,
                                  (size_type)in_stack_fffffffffffffe58);
              *piVar7 = iVar1;
              __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&local_e8);
            }
          }
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector(in_stack_fffffffffffffe70);
        }
        local_100 = local_48;
        local_108._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffe58);
        std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffe58);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffffe60,
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffffe58), bVar2) {
          piVar8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_108);
          *piVar8 = *piVar8 / local_14;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_108);
        }
      }
      MVar3 = ParallelContext::CommunicatorSub();
      MVar4 = ParallelDescriptor::Communicator();
      if (MVar3 == MVar4) {
        Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
                  ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    *)in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
        DistributionMapping::define
                  ((DistributionMapping *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      }
      else {
        in_stack_fffffffffffffe70 =
             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)Vector<int,_std::allocator<int>_>::size
                          ((Vector<int,_std::allocator<int>_> *)0x150b99d);
        std::allocator<int>::allocator((allocator<int> *)0x150b9b1);
        Vector<int,_std::allocator<int>_>::vector
                  ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe60,
                   (size_type)in_stack_fffffffffffffe58,(allocator_type *)0x150b9c5);
        std::allocator<int>::~allocator((allocator<int> *)0x150b9d1);
        in_stack_fffffffffffffe60 =
             (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
             std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x150b9db);
        in_stack_fffffffffffffe68 =
             (Vector<int,_std::allocator<int>_> *)
             std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x150b9ed);
        Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x150b9ff);
        ParallelContext::local_to_global_rank
                  ((int *)in_stack_fffffffffffffe60,(int *)in_stack_fffffffffffffe58,0);
        Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
                  ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                    *)in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
        DistributionMapping::define
                  ((DistributionMapping *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x150ba3c);
      }
      Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x150ba6b);
    }
  }
  return;
}

Assistant:

void
MLLinOp::makeConsolidatedDMap (const Vector<BoxArray>& ba, Vector<DistributionMapping>& dm,
                               int ratio, int strategy)
{
    BL_PROFILE("MLLinOp::makeConsolidatedDMap()");

    int factor = 1;
    BL_ASSERT(!dm[0].empty());
    for (int i = 1, N=ba.size(); i < N; ++i)
    {
        if (dm[i].empty())
        {
            factor *= ratio;

            const int nprocs = ParallelContext::NProcsSub();
            const auto& pmap_fine = dm[i-1].ProcessorMap();
            Vector<int> pmap(pmap_fine.size());
            ParallelContext::global_to_local_rank(pmap.data(), pmap_fine.data(), pmap.size());
            if (strategy == 1) {
                for (auto& x: pmap) {
                    x /= ratio;
                }
            } else if (strategy == 2) {
                int nprocs_con = static_cast<int>(std::ceil(static_cast<Real>(nprocs)
                                                            / static_cast<Real>(factor)));
                for (auto& x: pmap) {
                    auto d = std::div(x,nprocs_con);
                    x = d.rem;
                }
            } else if (strategy == 3) {
                if (factor == ratio) {
                    const std::vector< std::vector<int> >& sfc = DistributionMapping::makeSFC(ba[i]);
                    for (int iproc = 0; iproc < nprocs; ++iproc) {
                        for (int ibox : sfc[iproc]) {
                            pmap[ibox] = iproc;
                        }
                    }
                }
                for (auto& x: pmap) {
                    x /= ratio;
                }
            }

            if (ParallelContext::CommunicatorSub() == ParallelDescriptor::Communicator()) {
                dm[i].define(std::move(pmap));
            } else {
                Vector<int> pmap_g(pmap.size());
                ParallelContext::local_to_global_rank(pmap_g.data(), pmap.data(), pmap.size());
                dm[i].define(std::move(pmap_g));
            }
        }
    }
}